

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::fboc::details::TestBase::iterate(TestBase *this)

{
  size_t *this_00;
  undefined4 uVar1;
  bool bVar2;
  deUint32 fbo_00;
  RenderContext *context;
  Functions *pFVar3;
  FboVerifier *this_01;
  TestLog *pTVar4;
  FormatDB *ctxFormats;
  FormatDB *coreFormats;
  FormatDB *allFormats;
  MessageBuilder *pMVar5;
  char *msg;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_4e0;
  MessageBuilder local_4d0;
  byte local_34d;
  GLenum local_34c;
  bool validStatus;
  GetNameFunc p_Stack_348;
  GLenum fboStatus;
  int local_340;
  GetNameFunc local_338;
  int local_330;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  GetNameFunc local_2e8;
  int local_2e0;
  Enum<int,_2UL> local_2d8;
  MessageBuilder local_2c8;
  GLenum local_144;
  undefined1 local_140 [4];
  GLenum errorCode;
  ValidStatusCodes reference;
  IterateResult ret;
  undefined1 local_f8 [8];
  FboBuilder builder;
  Framebuffer fbo;
  TestBase *this_local;
  
  context = Context::getRenderContext(this->m_ctx);
  this_00 = &builder.m_configs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)this_00,context);
  fbo_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)this_00);
  pFVar3 = details::gl(this);
  FboUtil::FboBuilder::FboBuilder((FboBuilder *)local_f8,fbo_00,0x8d40,pFVar3);
  reference._48_4_ = (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,local_f8);
  this_01 = Context::getVerifier(this->m_ctx);
  FboUtil::FboVerifier::validStatusCodes
            ((ValidStatusCodes *)local_140,this_01,(Framebuffer *)local_f8);
  local_144 = FboUtil::FboBuilder::getError((FboBuilder *)local_f8);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  FboUtil::logFramebufferConfig((Framebuffer *)local_f8,pTVar4);
  ctxFormats = Context::getCtxFormats(this->m_ctx);
  coreFormats = Context::getCoreFormats(this->m_ctx);
  allFormats = Context::getAllFormats(this->m_ctx);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  logFormatInfo((Framebuffer *)local_f8,ctxFormats,coreFormats,allFormats,pTVar4);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  FboUtil::ValidStatusCodes::logRules((ValidStatusCodes *)local_140,pTVar4);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  FboUtil::ValidStatusCodes::logLegalResults((ValidStatusCodes *)local_140,pTVar4);
  if (local_144 == 0) {
    pFVar3 = details::gl(this);
    local_34c = (*pFVar3->checkFramebufferStatus)(0x8d40);
    local_34d = FboUtil::ValidStatusCodes::isFBOStatusValid((ValidStatusCodes *)local_140,local_34c)
    ;
    pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4d0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_4d0,(char (*) [10])"Received ");
    EVar6 = glu::getFramebufferStatusStr(local_34c);
    local_4e0.m_getName = EVar6.m_getName;
    local_4e0.m_value = EVar6.m_value;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_4e0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x128e7c9);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d0);
    if ((local_34d & 1) == 0) {
      if (local_34c == 0x8cd5) {
        fail(this,"Framebuffer checked as complete, expected incomplete");
      }
      else {
        bVar2 = FboUtil::ValidStatusCodes::isFBOStatusRequired((ValidStatusCodes *)local_140,0x8cd5)
        ;
        if (bVar2) {
          fail(this,"Framebuffer checked is incomplete, expected complete");
        }
        else {
          fail(this,"Framebuffer checked as incomplete, but with wrong status");
        }
      }
    }
    else if ((local_34c == 0x8cd5) ||
            (bVar2 = FboUtil::ValidStatusCodes::isFBOStatusValid
                               ((ValidStatusCodes *)local_140,0x8cd5), !bVar2)) {
      pass(this);
    }
    else {
      qualityWarning(this,"Framebuffer object could have checked as complete but did not.");
    }
  }
  else {
    pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_2c8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_2c8,(char (*) [10])"Received ");
    EVar6 = glu::getErrorStr(local_144);
    local_2e8 = EVar6.m_getName;
    local_2e0 = EVar6.m_value;
    local_2d8.m_getName = local_2e8;
    local_2d8.m_value = local_2e0;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2d8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [30])" (during FBO initialization).");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2c8);
    bVar2 = FboUtil::ValidStatusCodes::isErrorCodeValid((ValidStatusCodes *)local_140,local_144);
    if (bVar2) {
      pass(this);
    }
    else {
      bVar2 = FboUtil::ValidStatusCodes::isErrorCodeRequired((ValidStatusCodes *)local_140,0);
      if (bVar2) {
        EVar6 = glu::getErrorStr(local_144);
        p_Stack_348 = EVar6.m_getName;
        local_340 = EVar6.m_value;
        local_338 = p_Stack_348;
        local_330 = local_340;
        de::toString<tcu::Format::Enum<int,2ul>>(&local_328,(de *)&local_338,EVar6._8_8_);
        std::operator+(&local_308,"Expected no error but got ",&local_328);
        msg = (char *)std::__cxx11::string::c_str();
        fail(this,msg);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
      }
      else {
        fail(this,"Got wrong error code");
      }
    }
  }
  uVar1 = reference._48_4_;
  FboUtil::ValidStatusCodes::~ValidStatusCodes((ValidStatusCodes *)local_140);
  FboUtil::FboBuilder::~FboBuilder((FboBuilder *)local_f8);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)
             &builder.m_configs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return uVar1;
}

Assistant:

IterateResult TestBase::iterate (void)
{
	glu::Framebuffer		fbo			(m_ctx.getRenderContext());
	FboBuilder				builder		(*fbo, GL_FRAMEBUFFER, gl(*this));
	const IterateResult		ret			= build(builder);
	const ValidStatusCodes	reference	= m_ctx.getVerifier().validStatusCodes(builder);
	const GLenum			errorCode	= builder.getError();

	logFramebufferConfig(builder, m_testCtx.getLog());
	logFormatInfo(builder, m_ctx.getCtxFormats(), m_ctx.getCoreFormats(), m_ctx.getAllFormats(), m_testCtx.getLog());
	reference.logRules(m_testCtx.getLog());
	reference.logLegalResults(m_testCtx.getLog());

	// \todo [2013-12-04 lauri] Check if drawing operations succeed.

	if (errorCode != GL_NO_ERROR)
	{
		m_testCtx.getLog()
			<< TestLog::Message
			<< "Received " << glu::getErrorStr(errorCode) << " (during FBO initialization)."
			<< TestLog::EndMessage;

		if (reference.isErrorCodeValid(errorCode))
			pass();
		else if (reference.isErrorCodeRequired(GL_NO_ERROR))
			fail(("Expected no error but got " + de::toString(glu::getErrorStr(errorCode))).c_str());
		else
			fail("Got wrong error code");
	}
	else
	{
		const GLenum	fboStatus	= gl(*this).checkFramebufferStatus(GL_FRAMEBUFFER);
		const bool		validStatus	= reference.isFBOStatusValid(fboStatus);

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Received " << glu::getFramebufferStatusStr(fboStatus) << "."
			<< TestLog::EndMessage;

		if (!validStatus)
		{
			if (fboStatus == GL_FRAMEBUFFER_COMPLETE)
				fail("Framebuffer checked as complete, expected incomplete");
			else if (reference.isFBOStatusRequired(GL_FRAMEBUFFER_COMPLETE))
				fail("Framebuffer checked is incomplete, expected complete");
			else
				// An incomplete status is allowed, but not _this_ incomplete status.
				fail("Framebuffer checked as incomplete, but with wrong status");
		}
		else if (fboStatus != GL_FRAMEBUFFER_COMPLETE && reference.isFBOStatusValid(GL_FRAMEBUFFER_COMPLETE))
			qualityWarning("Framebuffer object could have checked as complete but did not.");
		else
			pass();
	}

	return ret;
}